

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall
iqxmlrpc::http::Request_header::set_authinfo(Request_header *this,string *u,string *p)

{
  Binary_data *this_00;
  string *__rhs;
  scoped_ptr<iqxmlrpc::Binary_data> bin_authinfo;
  string h;
  allocator<char> local_81;
  scoped_ptr<iqxmlrpc::Binary_data> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_78,u,":");
  std::operator+(&local_38,&local_78,p);
  std::__cxx11::string::~string((string *)&local_78);
  local_80.px = Binary_data::from_data(&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"authorization",&local_81);
  this_00 = boost::scoped_ptr<iqxmlrpc::Binary_data>::operator->(&local_80);
  __rhs = Binary_data::get_base64_abi_cxx11_(this_00);
  std::operator+(&local_58,"Basic ",__rhs);
  Header::set_option(&this->super_Header,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  if (local_80.px != (Binary_data *)0x0) {
    (*((local_80.px)->super_Value_type)._vptr_Value_type[1])();
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Request_header::set_authinfo(const std::string& u, const std::string& p)
{
  std::string h = u + ":" + p;
  boost::scoped_ptr<Binary_data> bin_authinfo( Binary_data::from_data(h) );
  set_option( names::authorization, "Basic " + bin_authinfo->get_base64() );
}